

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorSet::SerializeWithCachedSizes
          (FileDescriptorSet *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  FileDescriptorProto *value;
  UnknownFieldSet *pUVar3;
  undefined4 local_1c;
  int i;
  CodedOutputStream *output_local;
  FileDescriptorSet *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = file_size(this);
    if (iVar2 <= local_1c) break;
    value = file(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(1,(MessageLite *)value,output);
    local_1c = local_1c + 1;
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void FileDescriptorSet::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated .google.protobuf.FileDescriptorProto file = 1;
  for (int i = 0; i < this->file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}